

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O3

string * extractModelName(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  uVar3 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x3bee6f,0xffffffffffffffff);
  if (uVar3 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  uVar3 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x3da317,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
  iVar2 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar2 == 0) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar3);
    uVar3 = std::__cxx11::string::find_last_of
                      ((char *)__return_storage_ptr__,0x3da317,0xffffffffffffffff);
  }
  if (uVar3 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractModelName(const std::string filename) {
  // Extract model name
  std::string name = filename;
  std::size_t found = name.find_last_of("/\\");
  if (found < name.size()) name = name.substr(found + 1);
  found = name.find_last_of(".");
  if (name.substr(found + 1) == "gz"
      //      || name.substr(found + 1) == "zip"
  ) {
    name.erase(found, name.size() - found);
    found = name.find_last_of(".");
  }
  if (found < name.size()) name.erase(found, name.size() - found);
  return name;
}